

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

type __thiscall
chrono::ChValueSpecific<chrono::ChVector2<double>>::_archive_out<chrono::ChVector2<double>>
          (ChValueSpecific<chrono::ChVector2<double>> *this,ChArchiveOut *marchive)

{
  long lVar1;
  char *local_38;
  long local_30;
  undefined1 local_28;
  
  lVar1 = *(long *)(this + 0x30);
  ChArchiveOut::VersionWrite<chrono::ChVector2<double>>(marchive);
  local_38 = "x";
  local_28 = 0;
  local_30 = lVar1;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = lVar1 + 8;
  local_38 = "y";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveOUT<Tc>::value, void >::type
        _archive_out(ChArchiveOut& marchive) {
            this->_ptr_to_val->ArchiveOUT(marchive);
        }